

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManSimulateRound(Gia_ManSim_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *__s;
  uint *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  
  pGVar3 = p->pAig;
  if (pGVar3->nFront < 1) {
    __assert_fail("p->pAig->nFront > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1df,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  pGVar4 = pGVar3->pObjs;
  if (pGVar4->Value != 0) {
    __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1e0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  __s = p->pDataSim;
  if (0 < (long)p->nWords) {
    memset(__s,0,(long)p->nWords << 2);
  }
  iVar10 = 0;
  iVar7 = 0;
  if (1 < pGVar3->nObjs) {
    iVar7 = 0;
    lVar8 = 1;
    iVar10 = 0;
    do {
      pGVar1 = pGVar4 + lVar8;
      uVar11 = *(ulong *)pGVar1;
      uVar14 = (uint)uVar11;
      iVar6 = iVar10;
      if ((int)uVar14 < 0) {
        uVar2 = pGVar1->Value;
        if ((~uVar14 & 0x1fffffff) == 0) {
          if (pGVar3->nFront <= (int)uVar2) {
            __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                          ,0x1f0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
          }
          iVar12 = p->nWords;
          iVar6 = iVar10 + 1;
          if (0 < (long)iVar12) {
            puVar5 = p->pDataSimCis;
            uVar11 = (long)iVar12 + 1;
            do {
              __s[(long)(int)(uVar2 * iVar12) + (uVar11 - 2)] =
                   puVar5[(long)(iVar10 * iVar12) + (uVar11 - 2)];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
        else {
          if (uVar2 != 0x1fffffff) {
            __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                          ,0x1eb,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
          }
          uVar2 = p->nWords;
          iVar10 = uVar2 * iVar7;
          iVar7 = iVar7 + 1;
          iVar12 = (uVar14 & 0x1fffffff) * uVar2;
          puVar5 = p->pDataSimCos;
          if ((uVar14 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar2) {
              uVar11 = (ulong)uVar2 + 1;
              do {
                puVar5[(long)iVar10 + (uVar11 - 2)] = __s[(long)iVar12 + (uVar11 - 2)];
                uVar11 = uVar11 - 1;
              } while (1 < uVar11);
            }
          }
          else if (0 < (int)uVar2) {
            uVar11 = (ulong)uVar2 + 1;
            do {
              puVar5[(long)iVar10 + (uVar11 - 2)] = ~__s[(long)iVar12 + (uVar11 - 2)];
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
      }
      else {
        if (pGVar3->nFront <= (int)pGVar1->Value) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                        ,0x1e6,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        uVar2 = p->nWords;
        uVar9 = (ulong)uVar2;
        iVar10 = pGVar1->Value * uVar2;
        iVar12 = (uVar14 & 0x1fffffff) * uVar2;
        iVar13 = ((uint)(uVar11 >> 0x20) & 0x1fffffff) * uVar2;
        if ((uVar14 >> 0x1d & 1) == 0) {
          if ((uVar11 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar2) {
              uVar9 = uVar9 + 1;
              do {
                __s[(long)iVar10 + (uVar9 - 2)] =
                     __s[(long)iVar13 + (uVar9 - 2)] & __s[(long)iVar12 + (uVar9 - 2)];
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
          }
          else if (0 < (int)uVar2) {
            uVar9 = uVar9 + 1;
            do {
              __s[(long)iVar10 + (uVar9 - 2)] =
                   ~__s[(long)iVar13 + (uVar9 - 2)] & __s[(long)iVar12 + (uVar9 - 2)];
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
        }
        else if ((uVar11 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar2) {
            uVar9 = uVar9 + 1;
            do {
              __s[(long)iVar10 + (uVar9 - 2)] =
                   ~__s[(long)iVar12 + (uVar9 - 2)] & __s[(long)iVar13 + (uVar9 - 2)];
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
        }
        else if (0 < (int)uVar2) {
          uVar9 = uVar9 + 1;
          do {
            __s[(long)iVar10 + (uVar9 - 2)] =
                 ~(__s[(long)iVar13 + (uVar9 - 2)] | __s[(long)iVar12 + (uVar9 - 2)]);
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
      }
      iVar10 = iVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pGVar3->nObjs);
  }
  if (pGVar3->vCis->nSize != iVar10) {
    __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,500,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  if (pGVar3->vCos->nSize != iVar7) {
    __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1f5,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  return;
}

Assistant:

void Gia_ManSimulateRound( Gia_ManSim_t * p )
{
    Gia_Obj_t * pObj;
    int i, iCis = 0, iCos = 0;
    assert( p->pAig->nFront > 0 );
    assert( Gia_ManConst0(p->pAig)->Value == 0 );
    Gia_ManSimInfoZero( p, Gia_SimData(p, 0) );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAndOrConst0(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateNode( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == GIA_NONE );
            Gia_ManSimulateCo( p, iCos++, pObj );
        }
        else // if ( Gia_ObjIsCi(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateCi( p, pObj, iCis++ );
        }
    }
    assert( Gia_ManCiNum(p->pAig) == iCis );
    assert( Gia_ManCoNum(p->pAig) == iCos );
}